

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

CTxDestination *
AddAndGetMultisigDestination
          (int required,vector<CPubKey,_std::allocator<CPubKey>_> *pubkeys,OutputType type,
          FlatSigningProvider *keystore,CScript *script_out)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  size_type sVar5;
  int in_ECX;
  int in_ESI;
  string *in_RDI;
  FlatSigningProvider *in_R8;
  CScript *in_R9;
  long in_FS_OFFSET;
  CPubKey *pk;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range1;
  CTxDestination *dest;
  const_iterator __end1;
  const_iterator __begin1;
  CPubKey *in_stack_fffffffffffffe98;
  CScript *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int *in_stack_fffffffffffffec0;
  uint *in_stack_fffffffffffffec8;
  string *message;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  int iVar6;
  OutputType in_stack_ffffffffffffff04;
  int local_e4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 1) {
    uVar4 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee8,
               (char *)CONCAT17(in_stack_fffffffffffffee7,
                                CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),
               (allocator<char> *)in_RDI);
    JSONRPCError((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    message = in_RDI;
    sVar5 = std::vector<CPubKey,_std::allocator<CPubKey>_>::size
                      ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffe98);
    iVar6 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if ((int)sVar5 < in_ESI) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::vector<CPubKey,_std::allocator<CPubKey>_>::size
                ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffe98);
      tinyformat::format<unsigned_long,int>
                ((char *)message,(unsigned_long *)in_RDI,(int *)in_stack_fffffffffffffec8);
      JSONRPCError(iVar6,message);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      sVar5 = std::vector<CPubKey,_std::allocator<CPubKey>_>::size
                        ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffe98);
      iVar6 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (sVar5 < 0x15) {
        GetScriptForMultisig
                  (iVar6,(vector<CPubKey,_std::allocator<CPubKey>_> *)
                         CONCAT17(in_stack_fffffffffffffee7,
                                  CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
        CScript::operator=((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           in_stack_fffffffffffffea0);
        CScript::~CScript((CScript *)in_stack_fffffffffffffe98);
        std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
                  ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffea0);
        std::vector<CPubKey,_std::allocator<CPubKey>_>::end
                  ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffea0);
        while( true ) {
          iVar6 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          bVar2 = __gnu_cxx::
                  operator==<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                            ((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                              *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                             (__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                              *)in_stack_fffffffffffffea0);
          local_e4 = in_ECX;
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          in_stack_fffffffffffffee8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __gnu_cxx::
               __normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
               operator*((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                          *)in_stack_fffffffffffffe98);
          bVar2 = CPubKey::IsCompressed(in_stack_fffffffffffffe98);
          iVar6 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          if (!bVar2) {
            local_e4 = 0;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
          operator++((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                      *)in_stack_fffffffffffffe98);
        }
        if ((local_e4 == 0) &&
           (sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
           0x208 < sVar3)) {
          uVar4 = __cxa_allocate_exception(0x58);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          tinyformat::format<unsigned_int,unsigned_int>
                    ((char *)message,(uint *)in_RDI,in_stack_fffffffffffffec8);
          JSONRPCError(iVar6,message);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
        else {
          AddAndGetDestinationForScript(in_R8,in_R9,in_stack_ffffffffffffff04);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return (CTxDestination *)message;
          }
        }
      }
      else {
        uVar4 = __cxa_allocate_exception(0x58);
        tinyformat::format<int>((char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        JSONRPCError(iVar6,message);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination AddAndGetMultisigDestination(const int required, const std::vector<CPubKey>& pubkeys, OutputType type, FlatSigningProvider& keystore, CScript& script_out)
{
    // Gather public keys
    if (required < 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "a multisignature address must require at least one key to redeem");
    }
    if ((int)pubkeys.size() < required) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("not enough keys supplied (got %u keys, but need at least %d to redeem)", pubkeys.size(), required));
    }
    if (pubkeys.size() > MAX_PUBKEYS_PER_MULTISIG) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Number of keys involved in the multisignature address creation > %d\nReduce the number", MAX_PUBKEYS_PER_MULTISIG));
    }

    script_out = GetScriptForMultisig(required, pubkeys);

    // Check if any keys are uncompressed. If so, the type is legacy
    for (const CPubKey& pk : pubkeys) {
        if (!pk.IsCompressed()) {
            type = OutputType::LEGACY;
            break;
        }
    }

    if (type == OutputType::LEGACY && script_out.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, (strprintf("redeemScript exceeds size limit: %d > %d", script_out.size(), MAX_SCRIPT_ELEMENT_SIZE)));
    }

    // Make the address
    CTxDestination dest = AddAndGetDestinationForScript(keystore, script_out, type);

    return dest;
}